

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateMergeFrom
          (MessageGenerator *this,Printer *printer)

{
  FieldDescriptor *pFVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  LogMessage *pLVar5;
  pointer ppFVar6;
  FieldGenerator *pFVar7;
  ulong uVar8;
  undefined7 extraout_var;
  Descriptor *pDVar9;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint uVar10;
  uint extraout_EDX_01;
  uint extraout_EDX_02;
  uint extraout_EDX_03;
  uint extraout_EDX_04;
  uint extraout_EDX_05;
  uint extraout_EDX_06;
  uint extraout_EDX_07;
  uint extraout_EDX_08;
  ulong extraout_RDX;
  size_type sVar11;
  int new_index;
  int iVar12;
  uint uVar13;
  long *plVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  int iVar18;
  uint uVar19;
  FieldGeneratorMap *pFVar20;
  long lVar21;
  ulong uVar22;
  long lVar23;
  int iVar24;
  ulong uVar25;
  bool bVar26;
  bool bVar27;
  Hex hex;
  string mask;
  uint local_22c;
  undefined1 local_218 [48];
  int local_1e8;
  uint local_1e4;
  FieldGeneratorMap *local_1e0;
  string local_1d8;
  LogMessage local_1b8;
  LogMessage local_180;
  LogMessage local_148;
  LogMessage local_110;
  LogMessage local_d8;
  LogMessage local_a0;
  LogMessage local_68;
  
  if (((this->options_).enforce_lite == false) &&
     (*(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0xa0) + 0xa8) != 3)) {
    io::Printer::Print(printer,
                       "void $classname$::MergeFrom(const ::google::protobuf::Message& from) {\n// @@protoc_insertion_point(generalized_merge_from_start:$full_name$)\n  GOOGLE_DCHECK_NE(&from, this);\n"
                       ,"classname",&this->classname_,"full_name",
                       *(string **)(this->descriptor_ + 8));
    io::Printer::Indent(printer);
    io::Printer::Print(printer,
                       "const $classname$* source =\n    ::google::protobuf::internal::DynamicCastToGenerated<const $classname$>(\n        &from);\nif (source == NULL) {\n// @@protoc_insertion_point(generalized_merge_from_cast_fail:$full_name$)\n  ::google::protobuf::internal::ReflectionOps::Merge(from, this);\n} else {\n// @@protoc_insertion_point(generalized_merge_from_cast_success:$full_name$)\n  MergeFrom(*source);\n}\n"
                       ,"classname",&this->classname_,"full_name",
                       *(string **)(this->descriptor_ + 8));
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,"}\n\n");
  }
  else {
    io::Printer::Print(printer,
                       "void $classname$::CheckTypeAndMergeFrom(\n    const ::google::protobuf::MessageLite& from) {\n  MergeFrom(*::google::protobuf::down_cast<const $classname$*>(&from));\n}\n\n"
                       ,"classname",&this->classname_);
  }
  io::Printer::Print(printer,
                     "void $classname$::MergeFrom(const $classname$& from) {\n// @@protoc_insertion_point(class_specific_merge_from_start:$full_name$)\n  GOOGLE_DCHECK_NE(&from, this);\n"
                     ,"classname",&this->classname_,"full_name",*(string **)(this->descriptor_ + 8))
  ;
  io::Printer::Indent(printer);
  if (0 < *(int *)(this->descriptor_ + 0x68)) {
    io::Printer::Print(printer,"_extensions_.MergeFrom(from._extensions_);\n");
  }
  io::Printer::Print(printer,
                     "_internal_metadata_.MergeFrom(from._internal_metadata_);\n::google::protobuf::uint32 cached_has_bits = 0;\n(void) cached_has_bits;\n\n"
                    );
  if ((this->optimized_order_).
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->optimized_order_).
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_1e0 = &this->field_generators_;
    local_22c = 0xffffffff;
    iVar15 = -1;
    iVar12 = 0;
    do {
      if (iVar12 == iVar15) {
        internal::LogMessage::LogMessage
                  (&local_68,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                   ,0xbde);
        pLVar5 = internal::LogMessage::operator<<(&local_68,"CHECK failed: (i) != (last_i): ");
        internal::LogFinisher::operator=((LogFinisher *)local_218,pLVar5);
        internal::LogMessage::~LogMessage(&local_68);
      }
      uVar22 = (ulong)iVar12;
      ppFVar6 = (this->optimized_order_).
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      iVar4 = iVar12;
      if (uVar22 < (ulong)((long)(this->optimized_order_).
                                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar6 >> 3)) {
        do {
          if (*(int *)(ppFVar6[uVar22] + 0x4c) != 3) break;
          pFVar7 = FieldGeneratorMap::get(local_1e0,ppFVar6[uVar22]);
          (*pFVar7->_vptr_FieldGenerator[0xb])(pFVar7,printer);
          uVar22 = uVar22 + 1;
          ppFVar6 = (this->optimized_order_).
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        } while (uVar22 < (ulong)((long)(this->optimized_order_).
                                        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar6
                                 >> 3));
        iVar4 = (int)uVar22;
      }
      ppFVar6 = (this->optimized_order_).
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar22 = (long)(this->optimized_order_).
                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar6 >> 3;
      uVar8 = (ulong)iVar4;
      if (uVar8 < uVar22) {
        uVar19 = 0;
        iVar18 = -1;
        uVar17 = 0xffffffff;
        uVar25 = 0xffffffff;
        do {
          pFVar1 = ppFVar6[uVar8];
          bVar26 = false;
          uVar10 = 0;
          if (*(int *)(pFVar1 + 0x4c) != 3) {
            if (*(int *)(*(long *)(this->descriptor_ + 0x10) + 0x8c) != 3) {
              if (pFVar1[0x50] == (FieldDescriptor)0x0) {
                plVar14 = (long *)(*(long *)(pFVar1 + 0x58) + 0x30);
              }
              else if (*(long *)(pFVar1 + 0x68) == 0) {
                plVar14 = (long *)(*(long *)(pFVar1 + 0x30) + 0x98);
              }
              else {
                plVar14 = (long *)(*(long *)(pFVar1 + 0x68) + 0x80);
              }
              uVar10 = (this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_start
                       [(int)((ulong)((long)pFVar1 - *plVar14) >> 3) * 0x3cf3cf3d];
            }
            uVar13 = uVar10 + 7;
            if (-1 < (int)uVar10) {
              uVar13 = uVar10;
            }
            iVar15 = (int)uVar13 >> 3;
            if (iVar18 == -1) {
              uVar17 = uVar8 & 0xffffffff;
            }
            else {
              bVar26 = iVar15 != iVar18;
              iVar15 = iVar18;
              if (bVar26) {
                bVar26 = false;
                goto LAB_0025bbf3;
              }
            }
            uVar19 = uVar19 | 1 << (uVar10 & 0x1f);
            bVar26 = true;
            uVar25 = uVar8 & 0xffffffff;
            iVar18 = iVar15;
          }
LAB_0025bbf3:
          iVar16 = (int)uVar17;
          iVar24 = (int)uVar25;
        } while ((bVar26) && (uVar8 = uVar8 + 1, uVar8 < uVar22));
        iVar4 = (int)uVar8;
      }
      else {
        uVar19 = 0;
        iVar24 = -1;
        iVar16 = -1;
        iVar18 = -1;
      }
      iVar15 = iVar12;
      local_1e8 = iVar12;
      if (iVar18 != -1) {
        if (iVar16 == -1) {
          internal::LogMessage::LogMessage
                    (&local_a0,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                     ,0xc0b);
          pLVar5 = internal::LogMessage::operator<<
                             (&local_a0,"CHECK failed: (-1) != (last_chunk_start): ");
          internal::LogFinisher::operator=((LogFinisher *)local_218,pLVar5);
          internal::LogMessage::~LogMessage(&local_a0);
          uVar22 = extraout_RDX;
        }
        uVar10 = (uint)uVar22;
        if (iVar24 == -1) {
          internal::LogMessage::LogMessage
                    (&local_d8,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                     ,0xc0c);
          pLVar5 = internal::LogMessage::operator<<
                             (&local_d8,"CHECK failed: (-1) != (last_chunk_end): ");
          internal::LogFinisher::operator=((LogFinisher *)local_218,pLVar5);
          internal::LogMessage::~LogMessage(&local_d8);
          uVar10 = extraout_EDX;
        }
        if (uVar19 == 0) {
          internal::LogMessage::LogMessage
                    (&local_110,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                     ,0xc0d);
          pLVar5 = internal::LogMessage::operator<<
                             (&local_110,"CHECK failed: (0) != (last_chunk_mask): ");
          internal::LogFinisher::operator=((LogFinisher *)local_218,pLVar5);
          internal::LogMessage::~LogMessage(&local_110);
          uVar10 = extraout_EDX_00;
        }
        iVar12 = 0;
        if (uVar19 != 0) {
          uVar22 = (ulong)uVar19;
          do {
            uVar13 = (uint)uVar22;
            uVar10 = uVar13 & 1;
            iVar12 = iVar12 + uVar10;
            uVar22 = uVar22 >> 1;
          } while (1 < uVar13);
        }
        bVar26 = *(int *)(*(long *)(this->descriptor_ + 0x10) + 0x8c) != 3;
        bVar27 = iVar16 != iVar24;
        iVar15 = local_1e8;
        if (bVar27 && bVar26) {
          if (iVar12 < 2) {
            internal::LogMessage::LogMessage
                      (&local_148,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                       ,0xc17);
            pLVar5 = internal::LogMessage::operator<<(&local_148,"CHECK failed: (2) <= (count): ");
            internal::LogFinisher::operator=((LogFinisher *)local_218,pLVar5);
            internal::LogMessage::~LogMessage(&local_148);
            uVar10 = extraout_EDX_01;
          }
          if (8 < iVar12) {
            internal::LogMessage::LogMessage
                      (&local_180,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                       ,0xc18);
            pLVar5 = internal::LogMessage::operator<<(&local_180,"CHECK failed: (8) >= (count): ");
            internal::LogFinisher::operator=((LogFinisher *)local_218,pLVar5);
            internal::LogMessage::~LogMessage(&local_180);
            uVar10 = extraout_EDX_02;
          }
          iVar15 = iVar18 + 3;
          if (-1 < iVar18) {
            iVar15 = iVar18;
          }
          uVar13 = iVar15 >> 2;
          if (local_22c != uVar13) {
            SimpleItoa_abi_cxx11_((string *)local_218,(protobuf *)(ulong)uVar13,uVar10);
            io::Printer::Print(printer,"cached_has_bits = from._has_bits_[$new_index$];\n",
                               "new_index",(string *)local_218);
            uVar10 = extraout_EDX_03;
            local_22c = uVar13;
            if ((undefined1 *)local_218._0_8_ != local_218 + 0x10) {
              operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
              uVar10 = extraout_EDX_04;
            }
          }
          SimpleItoa_abi_cxx11_((string *)local_218,(protobuf *)(ulong)uVar19,uVar10);
          io::Printer::Print(printer,"if (cached_has_bits & $mask$u) {\n","mask",(string *)local_218
                            );
          iVar15 = local_1e8;
          if ((undefined1 *)local_218._0_8_ != local_218 + 0x10) {
            operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
          }
          io::Printer::Indent(printer);
          uVar10 = extraout_EDX_05;
        }
        if (iVar24 < iVar16) {
          uVar19 = 0;
        }
        else {
          lVar23 = (long)iVar16;
          iVar12 = (iVar24 - iVar16) + 1;
          local_1e4 = 0;
          do {
            pFVar1 = (this->optimized_order_).
                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar23];
            pFVar7 = FieldGeneratorMap::get(local_1e0,pFVar1);
            if (*(int *)(*(long *)(this->descriptor_ + 0x10) + 0x8c) == 3) {
              local_218._0_8_ = local_218 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"from.","");
              bVar2 = anon_unknown_0::EmitFieldNonDefaultCondition
                                (printer,(string *)local_218,pFVar1);
              if ((undefined1 *)local_218._0_8_ != local_218 + 0x10) {
                operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
              }
            }
            else {
              if (pFVar1[0x50] == (FieldDescriptor)0x0) {
                plVar14 = (long *)(*(long *)(pFVar1 + 0x58) + 0x30);
              }
              else if (*(long *)(pFVar1 + 0x68) == 0) {
                plVar14 = (long *)(*(long *)(pFVar1 + 0x30) + 0x98);
              }
              else {
                plVar14 = (long *)(*(long *)(pFVar1 + 0x68) + 0x80);
              }
              iVar15 = (this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_start
                       [(int)((ulong)((long)pFVar1 - *plVar14) >> 3) * 0x3cf3cf3d];
              iVar18 = iVar15 + 0x1f;
              if (-1 < iVar15) {
                iVar18 = iVar15;
              }
              if (((*(FieldDescriptor **)(pFVar1 + 0x80))[0x6f] == (FieldDescriptor)0x0) &&
                 (local_22c == iVar18 >> 5)) {
                hex.value = 1L << ((byte)iVar15 & 0x1f);
                hex._8_8_ = 8;
                strings::AlphaNum::AlphaNum((AlphaNum *)local_218,hex);
                local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_1d8,local_218._0_8_,
                           (pointer)(local_218._0_8_ + local_218._8_8_));
                io::Printer::Print(printer,"if (cached_has_bits & 0x$mask$u) {\n","mask",&local_1d8)
                ;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
                  operator_delete(local_1d8._M_dataplus._M_p,
                                  local_1d8.field_2._M_allocated_capacity + 1);
                }
              }
              else {
                FieldName_abi_cxx11_
                          ((string *)local_218,(cpp *)pFVar1,*(FieldDescriptor **)(pFVar1 + 0x80));
                io::Printer::Print(printer,"if (from.has_$name$()) {\n","name",(string *)local_218);
                if ((undefined1 *)local_218._0_8_ != local_218 + 0x10) {
                  operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
                }
              }
              io::Printer::Indent(printer);
              bVar2 = true;
            }
            if ((bVar27 && bVar26) && (bVar3 = anon_unknown_0::IsPOD(pFVar1), bVar3)) {
              local_1e4 = (uint)CONCAT71(extraout_var,1);
              lVar21 = 0x60;
            }
            else {
              lVar21 = 0x58;
            }
            (**(code **)((long)pFVar7->_vptr_FieldGenerator + lVar21))(pFVar7,printer);
            uVar10 = extraout_EDX_06;
            if (bVar2 != false) {
              io::Printer::Outdent(printer);
              io::Printer::Print(printer,"}\n");
              uVar10 = extraout_EDX_07;
            }
            lVar23 = lVar23 + 1;
            iVar12 = iVar12 + -1;
            uVar19 = local_1e4;
            iVar15 = local_1e8;
          } while (iVar12 != 0);
        }
        if (bVar27 && bVar26) {
          if ((uVar19 & 1) != 0) {
            if ((int)local_22c < 0) {
              internal::LogMessage::LogMessage
                        (&local_1b8,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                         ,0xc5d);
              pLVar5 = internal::LogMessage::operator<<
                                 (&local_1b8,"CHECK failed: (0) <= (cached_has_bit_index): ");
              internal::LogFinisher::operator=((LogFinisher *)local_218,pLVar5);
              internal::LogMessage::~LogMessage(&local_1b8);
              uVar10 = extraout_EDX_08;
            }
            SimpleItoa_abi_cxx11_((string *)local_218,(protobuf *)(ulong)local_22c,uVar10);
            io::Printer::Print(printer,"_has_bits_[$index$] |= cached_has_bits;\n","index",
                               (string *)local_218);
            if ((undefined1 *)local_218._0_8_ != local_218 + 0x10) {
              operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
            }
          }
          io::Printer::Outdent(printer);
          io::Printer::Print(printer,"}\n");
        }
      }
      iVar12 = iVar4;
    } while ((ulong)(long)iVar4 <
             (ulong)((long)(this->optimized_order_).
                           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->optimized_order_).
                           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  pDVar9 = this->descriptor_;
  if (0 < *(int *)(pDVar9 + 0x38)) {
    pFVar20 = (FieldGeneratorMap *)0x0;
    do {
      io::Printer::Print(printer,"switch (from.$oneofname$_case()) {\n","oneofname",
                         *(string **)(*(long *)(pDVar9 + 0x40) + (long)pFVar20 * 0x30));
      io::Printer::Indent(printer);
      lVar23 = *(long *)(this->descriptor_ + 0x40);
      local_1e0 = pFVar20;
      if (0 < *(int *)(lVar23 + 0x1c + (long)pFVar20 * 0x30)) {
        lVar21 = 0;
        do {
          pFVar1 = *(FieldDescriptor **)
                    (*(long *)(lVar23 + 0x20 + (long)pFVar20 * 0x30) + lVar21 * 8);
          UnderscoresToCamelCase((string *)local_218,*(string **)pFVar1,true);
          io::Printer::Print(printer,"case k$field_name$: {\n","field_name",(string *)local_218);
          if ((undefined1 *)local_218._0_8_ != local_218 + 0x10) {
            operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
          }
          io::Printer::Indent(printer);
          pFVar7 = FieldGeneratorMap::get(&this->field_generators_,pFVar1);
          (*pFVar7->_vptr_FieldGenerator[0xb])(pFVar7,printer);
          io::Printer::Print(printer,"break;\n");
          io::Printer::Outdent(printer);
          io::Printer::Print(printer,"}\n");
          lVar21 = lVar21 + 1;
          lVar23 = *(long *)(this->descriptor_ + 0x40);
        } while (lVar21 < *(int *)(lVar23 + 0x1c + (long)pFVar20 * 0x30));
      }
      plVar14 = *(long **)(lVar23 + (long)pFVar20 * 0x30);
      local_218._0_8_ = local_218 + 0x10;
      lVar23 = *plVar14;
      std::__cxx11::string::_M_construct<char*>((string *)local_218,lVar23,plVar14[1] + lVar23);
      if (local_218._8_8_ != 0) {
        sVar11 = 0;
        do {
          if ((byte)(*(char *)(local_218._0_8_ + sVar11) + 0x9fU) < 0x1a) {
            *(char *)(local_218._0_8_ + sVar11) = *(char *)(local_218._0_8_ + sVar11) + -0x20;
          }
          sVar11 = sVar11 + 1;
        } while (local_218._8_8_ != sVar11);
      }
      io::Printer::Print(printer,"case $cap_oneof_name$_NOT_SET: {\n  break;\n}\n","cap_oneof_name",
                         (string *)local_218);
      pFVar20 = local_1e0;
      if ((undefined1 *)local_218._0_8_ != local_218 + 0x10) {
        operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
      }
      io::Printer::Outdent(printer);
      io::Printer::Print(printer,"}\n");
      pFVar20 = (FieldGeneratorMap *)((long)&pFVar20->descriptor_ + 1);
      pDVar9 = this->descriptor_;
    } while ((long)pFVar20 < (long)*(int *)(pDVar9 + 0x38));
  }
  if (this->num_weak_fields_ != 0) {
    io::Printer::Print(printer,"_weak_field_map_.MergeFrom(from._weak_field_map_);\n");
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n");
  return;
}

Assistant:

void MessageGenerator::
GenerateMergeFrom(io::Printer* printer) {
  if (HasDescriptorMethods(descriptor_->file(), options_)) {
    // Generate the generalized MergeFrom (aka that which takes in the Message
    // base class as a parameter).
    printer->Print(
        "void $classname$::MergeFrom(const ::google::protobuf::Message& from) {\n"
        "// @@protoc_insertion_point(generalized_merge_from_start:"
        "$full_name$)\n"
        "  GOOGLE_DCHECK_NE(&from, this);\n",
        "classname", classname_, "full_name", descriptor_->full_name());
    printer->Indent();

    // Cast the message to the proper type. If we find that the message is
    // *not* of the proper type, we can still call Merge via the reflection
    // system, as the GOOGLE_CHECK above ensured that we have the same descriptor
    // for each message.
    printer->Print(
      "const $classname$* source =\n"
      "    ::google::protobuf::internal::DynamicCastToGenerated<const $classname$>(\n"
      "        &from);\n"
      "if (source == NULL) {\n"
      "// @@protoc_insertion_point(generalized_merge_from_cast_fail:"
      "$full_name$)\n"
      "  ::google::protobuf::internal::ReflectionOps::Merge(from, this);\n"
      "} else {\n"
      "// @@protoc_insertion_point(generalized_merge_from_cast_success:"
      "$full_name$)\n"
      "  MergeFrom(*source);\n"
      "}\n",
      "classname", classname_, "full_name", descriptor_->full_name());

    printer->Outdent();
    printer->Print("}\n\n");
  } else {
    // Generate CheckTypeAndMergeFrom().
    printer->Print(
      "void $classname$::CheckTypeAndMergeFrom(\n"
      "    const ::google::protobuf::MessageLite& from) {\n"
      "  MergeFrom(*::google::protobuf::down_cast<const $classname$*>(&from));\n"
      "}\n"
      "\n",
      "classname", classname_);
  }

  // Generate the class-specific MergeFrom, which avoids the GOOGLE_CHECK and cast.
  printer->Print(
      "void $classname$::MergeFrom(const $classname$& from) {\n"
      "// @@protoc_insertion_point(class_specific_merge_from_start:"
      "$full_name$)\n"
      "  GOOGLE_DCHECK_NE(&from, this);\n",
      "classname", classname_, "full_name", descriptor_->full_name());
  printer->Indent();

  if (descriptor_->extension_range_count() > 0) {
    printer->Print("_extensions_.MergeFrom(from._extensions_);\n");
  }

  printer->Print(
    "_internal_metadata_.MergeFrom(from._internal_metadata_);\n"
    "::google::protobuf::uint32 cached_has_bits = 0;\n"
    "(void) cached_has_bits;\n\n");

  // cached_has_bit_index maintains that:
  //   cached_has_bits = from._has_bits_[cached_has_bit_index]
  // for cached_has_bit_index >= 0
  int cached_has_bit_index = -1;

  int last_i = -1;
  for (int i = 0; i < optimized_order_.size(); ) {
    // Detect infinite loops.
    GOOGLE_CHECK_NE(i, last_i);
    last_i = i;

    // Merge Repeated fields. These fields do not require a
    // check as we can simply iterate over them.
    for (; i < optimized_order_.size(); i++) {
      const FieldDescriptor* field = optimized_order_[i];
      if (!field->is_repeated()) {
        break;
      }

      const FieldGenerator& generator = field_generators_.get(field);
      generator.GenerateMergingCode(printer);
    }

    // Merge Optional and Required fields (after a _has_bit_ check).
    int last_chunk = -1;
    int last_chunk_start = -1;
    int last_chunk_end = -1;
    uint32 last_chunk_mask = 0;
    for (; i < optimized_order_.size(); i++) {
      const FieldDescriptor* field = optimized_order_[i];
      if (field->is_repeated()) {
        break;
      }

      // "index" defines where in the _has_bits_ the field appears.
      // "i" is our loop counter within optimized_order_.
      int index = HasFieldPresence(descriptor_->file()) ?
          has_bit_indices_[field->index()] : 0;
      int chunk = index / 8;

      if (last_chunk == -1) {
        last_chunk = chunk;
        last_chunk_start = i;
      } else if (chunk != last_chunk) {
        // Emit the fields for this chunk so far.
        break;
      }

      last_chunk_end = i;
      last_chunk_mask |= static_cast<uint32>(1) << (index % 32);
    }

    if (last_chunk != -1) {
      GOOGLE_DCHECK_NE(-1, last_chunk_start);
      GOOGLE_DCHECK_NE(-1, last_chunk_end);
      GOOGLE_DCHECK_NE(0, last_chunk_mask);

      const int count = popcnt(last_chunk_mask);
      const bool have_outer_if = HasFieldPresence(descriptor_->file()) &&
          (last_chunk_start != last_chunk_end);

      if (have_outer_if) {
        // Check (up to) 8 has_bits at a time if we have more than one field in
        // this chunk.  Due to field layout ordering, we may check
        // _has_bits_[last_chunk * 8 / 32] multiple times.
        GOOGLE_DCHECK_LE(2, count);
        GOOGLE_DCHECK_GE(8, count);

        if (cached_has_bit_index != last_chunk / 4) {
          int new_index = last_chunk / 4;
          printer->Print("cached_has_bits = from._has_bits_[$new_index$];\n",
                         "new_index", SimpleItoa(new_index));
          cached_has_bit_index = new_index;
        }

        printer->Print(
          "if (cached_has_bits & $mask$u) {\n",
          "mask", SimpleItoa(last_chunk_mask));
        printer->Indent();
      }

      // Go back and emit clears for each of the fields we processed.
      bool deferred_has_bit_changes = false;
      for (int j = last_chunk_start; j <= last_chunk_end; j++) {
        const FieldDescriptor* field = optimized_order_[j];
        const FieldGenerator& generator = field_generators_.get(field);

        bool have_enclosing_if = false;
        if (HasFieldPresence(descriptor_->file())) {
          // Attempt to use the state of cached_has_bits, if possible.
          int has_bit_index = has_bit_indices_[field->index()];
          if (!field->options().weak() &&
              cached_has_bit_index == has_bit_index / 32) {
            const string mask = StrCat(
                strings::Hex(1u << (has_bit_index % 32),
                strings::ZERO_PAD_8));

            printer->Print(
                "if (cached_has_bits & 0x$mask$u) {\n", "mask", mask);
          } else {
            printer->Print(
              "if (from.has_$name$()) {\n",
              "name", FieldName(field));
          }

          printer->Indent();
          have_enclosing_if = true;
        } else {
          // Merge semantics without true field presence: primitive fields are
          // merged only if non-zero (numeric) or non-empty (string).
          have_enclosing_if = EmitFieldNonDefaultCondition(
              printer, "from.", field);
        }

        if (have_outer_if && IsPOD(field)) {
          // GenerateCopyConstructorCode for enum and primitive scalar fields
          // does not do _has_bits_ modifications.  We defer _has_bits_
          // manipulation until the end of the outer if.
          //
          // This can reduce the number of loads/stores by up to 7 per 8 fields.
          deferred_has_bit_changes = true;
          generator.GenerateCopyConstructorCode(printer);
        } else {
          generator.GenerateMergingCode(printer);
        }

        if (have_enclosing_if) {
          printer->Outdent();
          printer->Print("}\n");
        }
      }

      if (have_outer_if) {
        if (deferred_has_bit_changes) {
          // Flush the has bits for the primitives we deferred.
          GOOGLE_CHECK_LE(0, cached_has_bit_index);
          printer->Print(
              "_has_bits_[$index$] |= cached_has_bits;\n",
              "index", SimpleItoa(cached_has_bit_index));
        }

        printer->Outdent();
        printer->Print("}\n");
      }
    }
  }

  // Merge oneof fields. Oneof field requires oneof case check.
  for (int i = 0; i < descriptor_->oneof_decl_count(); ++i) {
    printer->Print(
        "switch (from.$oneofname$_case()) {\n",
        "oneofname", descriptor_->oneof_decl(i)->name());
    printer->Indent();
    for (int j = 0; j < descriptor_->oneof_decl(i)->field_count(); j++) {
      const FieldDescriptor* field = descriptor_->oneof_decl(i)->field(j);
      printer->Print(
          "case k$field_name$: {\n",
          "field_name", UnderscoresToCamelCase(field->name(), true));
      printer->Indent();
      field_generators_.get(field).GenerateMergingCode(printer);
      printer->Print(
          "break;\n");
      printer->Outdent();
      printer->Print(
          "}\n");
    }
    printer->Print(
        "case $cap_oneof_name$_NOT_SET: {\n"
        "  break;\n"
        "}\n",
        "cap_oneof_name",
        ToUpper(descriptor_->oneof_decl(i)->name()));
    printer->Outdent();
    printer->Print(
        "}\n");
  }
  if (num_weak_fields_) {
    printer->Print("_weak_field_map_.MergeFrom(from._weak_field_map_);\n");
  }

  printer->Outdent();
  printer->Print("}\n");
}